

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByName(Descriptor *this,string *key)

{
  char *__s1;
  long lVar1;
  ulong uVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  FieldDescriptor *pFVar7;
  long lVar8;
  char *pcVar9;
  long *plVar10;
  long *plVar11;
  
  __s1 = (key->_M_dataplus)._M_p;
  cVar4 = *__s1;
  if (cVar4 == '\0') {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    pcVar9 = __s1;
    do {
      pcVar9 = pcVar9 + 1;
      lVar8 = (long)cVar4 + lVar8 * 5;
      cVar4 = *pcVar9;
    } while (cVar4 != '\0');
  }
  lVar1 = *(long *)(*(long *)(*(long *)(this + 0x10) + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(*(long *)(this + 0x10) + 0x90) + 0x10);
  plVar6 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar8) % uVar2) * 8);
  plVar11 = (long *)0x0;
  if (plVar6 != (long *)0x0) {
    do {
      if (((Descriptor *)*plVar6 == this) &&
         (iVar5 = strcmp(__s1,(char *)plVar6[1]), plVar11 = plVar6, iVar5 == 0)) break;
      plVar6 = (long *)plVar6[4];
      plVar11 = (long *)0x0;
    } while (plVar6 != (long *)0x0);
  }
  if (plVar11 == (long *)0x0) {
    plVar11 = *(long **)(lVar1 + uVar2 * 8);
  }
  plVar3 = *(long **)(lVar1 + uVar2 * 8);
  plVar6 = plVar11 + 2;
  plVar10 = plVar6;
  if (plVar11 == plVar3) {
    plVar10 = (long *)&(anonymous_namespace)::kNullSymbol;
  }
  if (((int)*plVar10 == 2) || ((anonymous_namespace)::kNullSymbol != 0)) {
    if (plVar11 == plVar3) {
      plVar6 = (long *)&(anonymous_namespace)::kNullSymbol;
    }
    if ((int)*plVar10 != 2) {
      plVar6 = (long *)&(anonymous_namespace)::kNullSymbol;
    }
    pFVar7 = (FieldDescriptor *)plVar6[1];
    if (pFVar7[0x34] != (FieldDescriptor)0x0) {
      pFVar7 = (FieldDescriptor *)0x0;
    }
  }
  else {
    pFVar7 = (FieldDescriptor *)0x0;
  }
  return pFVar7;
}

Assistant:

const FieldDescriptor*
Descriptor::FindFieldByName(const string& key) const {
  Symbol result =
    file()->tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && !result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}